

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O3

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::line
          (rasterizer_cells_aa<agg::cell_aa> *this,int x1,int y1,int x2,int y2)

{
  cell_type *pcVar1;
  cell_type *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int ex;
  long local_60;
  
  lVar9 = (long)x2 - (long)x1;
  if (lVar9 - 0x400000U < 0xffffffffff800001) {
    iVar16 = (int)((ulong)((long)x2 + (long)x1) >> 1);
    iVar11 = (int)((ulong)((long)y2 + (long)y1) >> 1);
    line(this,x1,y1,iVar16,iVar11);
    line(this,iVar16,iVar11,x2,y2);
  }
  local_60 = (long)y1;
  iVar11 = x1 >> 8;
  iVar16 = this->m_min_x;
  if (iVar11 < this->m_min_x) {
    this->m_min_x = iVar11;
    iVar16 = iVar11;
  }
  iVar18 = y1 >> 8;
  iVar12 = this->m_max_x;
  if (this->m_max_x < iVar11) {
    this->m_max_x = iVar11;
    iVar12 = iVar11;
  }
  iVar7 = this->m_min_y;
  if (iVar18 < this->m_min_y) {
    this->m_min_y = iVar18;
    iVar7 = iVar18;
  }
  iVar15 = x2 >> 8;
  iVar10 = this->m_max_y;
  if (this->m_max_y < iVar18) {
    this->m_max_y = iVar18;
    iVar10 = iVar18;
  }
  if (iVar15 < iVar16) {
    this->m_min_x = iVar15;
  }
  iVar16 = y2 >> 8;
  if (iVar12 < iVar15) {
    this->m_max_x = iVar15;
  }
  if (iVar16 < iVar7) {
    this->m_min_y = iVar16;
  }
  if (iVar10 < iVar16) {
    this->m_max_y = iVar16;
  }
  pcVar1 = &this->m_curr_cell;
  if (((this->m_curr_cell).x != iVar11) || ((this->m_curr_cell).y != iVar18)) {
    if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00112b7b;
        allocate_block(this);
      }
      pcVar2 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar2 + 1;
      iVar12 = pcVar1->y;
      iVar7 = (this->m_curr_cell).cover;
      iVar10 = (this->m_curr_cell).area;
      pcVar2->x = pcVar1->x;
      pcVar2->y = iVar12;
      pcVar2->cover = iVar7;
      pcVar2->area = iVar10;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00112b7b:
    (this->m_curr_cell).x = iVar11;
    (this->m_curr_cell).y = iVar18;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
  }
  uVar17 = y1 & 0xff;
  iVar12 = x1;
  if (iVar18 == iVar16) goto LAB_00112f1b;
  local_60 = y2 - local_60;
  if (x2 == x1) {
    iVar12 = (x2 & 0xffU) * 2;
    iVar10 = (uint)(-1 < local_60) * 0x100;
    iVar7 = iVar10 - uVar17;
    iVar15 = (this->m_curr_cell).cover + iVar7;
    (this->m_curr_cell).cover = iVar15;
    iVar7 = iVar7 * iVar12 + (this->m_curr_cell).area;
    uVar17 = (uint)(local_60 >> 0x3f) | 1;
    (this->m_curr_cell).area = iVar7;
    if (iVar7 != 0 || iVar15 != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00112c3b;
        allocate_block(this);
      }
      pcVar2 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar2 + 1;
      iVar7 = pcVar1->y;
      iVar15 = (this->m_curr_cell).cover;
      iVar3 = (this->m_curr_cell).area;
      pcVar2->x = pcVar1->x;
      pcVar2->y = iVar7;
      pcVar2->cover = iVar15;
      pcVar2->area = iVar3;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00112c3b:
    (this->m_curr_cell).x = iVar11;
    (this->m_curr_cell).y = uVar17 + iVar18;
    if (uVar17 + iVar18 != iVar16) {
      iVar7 = (uint)(-1 < local_60) * 0x200 + -0x100;
      do {
        (this->m_curr_cell).cover = iVar7;
        (this->m_curr_cell).area = iVar7 * iVar12;
        if ((this->m_num_cells & 0xfff) == 0) {
          if (this->m_num_blocks < 0x400) {
            allocate_block(this);
            goto LAB_00112cad;
          }
        }
        else {
LAB_00112cad:
          pcVar2 = this->m_curr_cell_ptr;
          this->m_curr_cell_ptr = pcVar2 + 1;
          iVar15 = pcVar1->y;
          iVar3 = (this->m_curr_cell).cover;
          iVar4 = (this->m_curr_cell).area;
          pcVar2->x = pcVar1->x;
          pcVar2->y = iVar15;
          pcVar2->cover = iVar3;
          pcVar2->area = iVar4;
          this->m_num_cells = this->m_num_cells + 1;
        }
        (this->m_curr_cell).x = iVar11;
        (this->m_curr_cell).y = uVar17 * 2 + iVar18;
        (this->m_curr_cell).cover = 0;
        (this->m_curr_cell).area = 0;
        iVar18 = iVar18 + uVar17;
      } while (iVar16 - uVar17 != iVar18);
    }
    iVar10 = iVar10 + (y2 | 0xffffff00U);
    (this->m_curr_cell).cover = iVar10;
    (this->m_curr_cell).area = iVar10 * iVar12;
    return;
  }
  if (local_60 < 0) {
    local_60 = -local_60;
    iVar7 = -1;
    iVar11 = 0;
    uVar8 = uVar17;
  }
  else {
    iVar11 = 0x100;
    iVar7 = 1;
    uVar8 = 0x100 - uVar17;
  }
  iVar10 = (int)((long)((ulong)uVar8 * lVar9) % local_60);
  iVar12 = (iVar10 >> 0x1f) + x1 + (int)((long)((ulong)uVar8 * lVar9) / local_60);
  render_hline(this,iVar18,x1,uVar17,iVar12,iVar11);
  iVar15 = iVar7 + iVar18;
  if (((this->m_curr_cell).y != iVar15) || ((this->m_curr_cell).x != iVar12 >> 8)) {
    if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_00112dd7;
        allocate_block(this);
      }
      pcVar2 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar2 + 1;
      iVar3 = pcVar1->y;
      iVar4 = (this->m_curr_cell).cover;
      iVar14 = (this->m_curr_cell).area;
      pcVar2->x = pcVar1->x;
      pcVar2->y = iVar3;
      pcVar2->cover = iVar4;
      pcVar2->area = iVar14;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_00112dd7:
    (this->m_curr_cell).x = iVar12 >> 8;
    (this->m_curr_cell).y = iVar15;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
  }
  if (iVar15 == iVar16) {
    uVar17 = 0x100 - iVar11;
    iVar18 = iVar16;
  }
  else {
    iVar3 = (int)((lVar9 * 0x100) % local_60);
    iVar4 = (int)local_60;
    iVar14 = iVar3 + iVar4;
    if (-1 < iVar3) {
      iVar14 = iVar3;
    }
    iVar13 = iVar4;
    if (iVar10 < 0) {
      iVar13 = 0;
    }
    iVar10 = iVar10 - iVar13;
    uVar17 = 0x100 - iVar11;
    iVar19 = iVar18 + iVar7 * 2;
    iVar13 = iVar12;
    do {
      iVar10 = iVar10 + iVar14;
      iVar18 = iVar4;
      if (-1 >= iVar10) {
        iVar18 = 0;
      }
      iVar12 = (uint)(-1 < iVar10) + (iVar3 >> 0x1f) + (int)((lVar9 * 0x100) / local_60) + iVar13;
      render_hline(this,iVar15,iVar13,uVar17,iVar12,iVar11);
      if (((this->m_curr_cell).x != iVar12 >> 8) || (iVar19 != (this->m_curr_cell).y)) {
        if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
          if ((this->m_num_cells & 0xfff) == 0) {
            if (0x3ff < this->m_num_blocks) goto LAB_00112edc;
            allocate_block(this);
          }
          pcVar2 = this->m_curr_cell_ptr;
          this->m_curr_cell_ptr = pcVar2 + 1;
          iVar13 = pcVar1->y;
          iVar5 = (this->m_curr_cell).cover;
          iVar6 = (this->m_curr_cell).area;
          pcVar2->x = pcVar1->x;
          pcVar2->y = iVar13;
          pcVar2->cover = iVar5;
          pcVar2->area = iVar6;
          this->m_num_cells = this->m_num_cells + 1;
        }
LAB_00112edc:
        (this->m_curr_cell).x = iVar12 >> 8;
        (this->m_curr_cell).y = iVar19;
        (this->m_curr_cell).cover = 0;
        (this->m_curr_cell).area = 0;
      }
      iVar10 = iVar10 - iVar18;
      iVar15 = iVar15 + iVar7;
      iVar19 = iVar19 + iVar7;
      iVar18 = iVar16;
      iVar13 = iVar12;
    } while (iVar16 != iVar15);
  }
LAB_00112f1b:
  render_hline(this,iVar18,iVar12,uVar17,x2,y2 & 0xff);
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::line(int x1, int y1, int x2, int y2)
    {
        enum dx_limit_e { dx_limit = 16384 << poly_subpixel_shift };

        long long dx = (long long)x2 - (long long)x1;

        if(dx >= dx_limit || dx <= -dx_limit)
        {
            int cx = (int)(((long long)x1 + (long long)x2) >> 1);
            int cy = (int)(((long long)y1 + (long long)y2) >> 1);
            line(x1, y1, cx, cy);
            line(cx, cy, x2, y2);
        }

        long long dy = (long long)y2 - (long long)y1;
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int ey1 = y1 >> poly_subpixel_shift;
        int ey2 = y2 >> poly_subpixel_shift;
        int fy1 = y1 & poly_subpixel_mask;
        int fy2 = y2 & poly_subpixel_mask;

        int x_from, x_to;
        int rem, mod, lift, delta, first, incr;
        long long p;

        if(ex1 < m_min_x) m_min_x = ex1;
        if(ex1 > m_max_x) m_max_x = ex1;
        if(ey1 < m_min_y) m_min_y = ey1;
        if(ey1 > m_max_y) m_max_y = ey1;
        if(ex2 < m_min_x) m_min_x = ex2;
        if(ex2 > m_max_x) m_max_x = ex2;
        if(ey2 < m_min_y) m_min_y = ey2;
        if(ey2 > m_max_y) m_max_y = ey2;

        set_curr_cell(ex1, ey1);

        //everything is on a single hline
        if(ey1 == ey2)
        {
            render_hline(ey1, x1, fy1, x2, fy2);
            return;
        }

        //Vertical line - we have to calculate start and end cells,
        //and then - the common values of the area and coverage for
        //all cells of the line. We know exactly there's only one 
        //cell, so, we don't have to call render_hline().
        incr  = 1;
        if(dx == 0)
        {
            int ex = x1 >> poly_subpixel_shift;
            int two_fx = (x1 - (ex << poly_subpixel_shift)) << 1;
            int area;

            first = poly_subpixel_scale;
            if(dy < 0)
            {
                first = 0;
                incr  = -1;
            }

            x_from = x1;

            //render_hline(ey1, x_from, fy1, x_from, first);
            delta = first - fy1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;

            ey1 += incr;
            set_curr_cell(ex, ey1);

            delta = first + first - poly_subpixel_scale;
            area = two_fx * delta;
            while(ey1 != ey2)
            {
                //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, first);
                m_curr_cell.cover = delta;
                m_curr_cell.area  = area;
                ey1 += incr;
                set_curr_cell(ex, ey1);
            }
            //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, fy2);
            delta = fy2 - poly_subpixel_scale + first;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;
            return;
        }

        //ok, we have to render several hlines
        p     = (poly_subpixel_scale - fy1) * dx;
        first = poly_subpixel_scale;

        if(dy < 0)
        {
            p     = fy1 * dx;
            first = 0;
            incr  = -1;
            dy    = -dy;
        }

        delta = (int)(p / dy);
        mod   = (int)(p % dy);

        if(mod < 0)
        {
            delta--;
            mod += dy;
        }

        x_from = x1 + delta;
        render_hline(ey1, x1, fy1, x_from, first);

        ey1 += incr;
        set_curr_cell(x_from >> poly_subpixel_shift, ey1);

        if(ey1 != ey2)
        {
            p     = poly_subpixel_scale * dx;
            lift  = (int)(p / dy);
            rem   = (int)(p % dy);

            if(rem < 0)
            {
                lift--;
                rem += dy;
            }
            mod -= dy;

            while(ey1 != ey2)
            {
                delta = lift;
                mod  += rem;
                if (mod >= 0)
                {
                    mod -= dy;
                    delta++;
                }

                x_to = x_from + delta;
                render_hline(ey1, x_from, poly_subpixel_scale - first, x_to, first);
                x_from = x_to;

                ey1 += incr;
                set_curr_cell(x_from >> poly_subpixel_shift, ey1);
            }
        }
        render_hline(ey1, x_from, poly_subpixel_scale - first, x2, fy2);
    }